

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool bssl::anon_unknown_18::CheckResponderIDMatchesCertificate
               (ResponderID *id,ParsedCertificate *cert)

{
  anon_unknown_18 *this;
  Input value;
  Input b_rdn_sequence;
  Input a_rdn_sequence;
  bool bVar1;
  ParsedTbsCertificate *pPVar2;
  EVP_MD *type;
  Input spki_tlv;
  byte local_f5;
  undefined1 local_c0 [8];
  Input key;
  Parser local_80;
  uchar *local_68;
  size_t local_60;
  Parser local_58;
  undefined1 local_40 [8];
  Input cert_rdn;
  Input name_rdn;
  ParsedCertificate *cert_local;
  ResponderID *id_local;
  
  if (id->type == NAME) {
    bssl::der::Input::Input((Input *)&cert_rdn.data_.size_);
    bssl::der::Input::Input((Input *)local_40);
    local_68 = (id->name).data_.data_;
    local_60 = (id->name).data_.size_;
    bssl::der::Parser::Parser(&local_58,(Input)(id->name).data_);
    bVar1 = bssl::der::Parser::ReadTag(&local_58,0x20000010,(Input *)&cert_rdn.data_.size_);
    local_f5 = 1;
    if (bVar1) {
      pPVar2 = ParsedCertificate::tbs(cert);
      bssl::der::Parser::Parser(&local_80,(Input)(pPVar2->subject_tlv).data_);
      bVar1 = bssl::der::Parser::ReadTag(&local_80,0x20000010,(Input *)local_40);
      local_f5 = bVar1 ^ 0xff;
    }
    if ((local_f5 & 1) == 0) {
      key.data_.size_ = (size_t)local_40;
      a_rdn_sequence.data_.size_ = (size_t)name_rdn.data_.data_;
      a_rdn_sequence.data_.data_ = (uchar *)cert_rdn.data_.size_;
      b_rdn_sequence.data_.size_ = (size_t)cert_rdn.data_.data_;
      b_rdn_sequence.data_.data_ = (uchar *)local_40;
      id_local._7_1_ = VerifyNameMatch(a_rdn_sequence,b_rdn_sequence);
    }
    else {
      id_local._7_1_ = false;
    }
  }
  else if (id->type == KEY_HASH) {
    bssl::der::Input::Input((Input *)local_c0);
    pPVar2 = ParsedCertificate::tbs(cert);
    this = (anon_unknown_18 *)(pPVar2->spki_tlv).data_.data_;
    spki_tlv.data_.size_ = (size_t)local_c0;
    spki_tlv.data_.data_ = (uchar *)(pPVar2->spki_tlv).data_.size_;
    bVar1 = GetSubjectPublicKeyBytes(this,spki_tlv,(Input *)this);
    if (bVar1) {
      type = EVP_sha1();
      value.data_.size_ = (size_t)key.data_.data_;
      value.data_.data_ = (uchar *)local_c0;
      id_local._7_1_ = VerifyHash((EVP_MD *)type,(Input)(id->key_hash).data_,value);
    }
    else {
      id_local._7_1_ = false;
    }
  }
  else {
    id_local._7_1_ = false;
  }
  return id_local._7_1_;
}

Assistant:

[[nodiscard]] bool CheckResponderIDMatchesCertificate(
    const OCSPResponseData::ResponderID &id, const ParsedCertificate *cert) {
  switch (id.type) {
    case OCSPResponseData::ResponderType::NAME: {
      der::Input name_rdn;
      der::Input cert_rdn;
      if (!der::Parser(id.name).ReadTag(CBS_ASN1_SEQUENCE, &name_rdn) ||
          !der::Parser(cert->tbs().subject_tlv)
               .ReadTag(CBS_ASN1_SEQUENCE, &cert_rdn)) {
        return false;
      }
      return VerifyNameMatch(name_rdn, cert_rdn);
    }
    case OCSPResponseData::ResponderType::KEY_HASH: {
      der::Input key;
      if (!GetSubjectPublicKeyBytes(cert->tbs().spki_tlv, &key)) {
        return false;
      }
      return VerifyHash(EVP_sha1(), id.key_hash, key);
    }
  }

  return false;
}